

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::SliderBehaviorT<long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,longlong *v,longlong v_min,
               longlong v_max,char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  bool bVar1;
  ImGuiContext *pIVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  longlong lVar7;
  undefined *v_00;
  ImGuiDataType data_type_00;
  long lVar8;
  undefined8 unaff_RBX;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  ImVec2 IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar2 = GImGui;
  uVar10 = (ulong)(flags & 1);
  uVar9 = data_type & 0xfffffffe;
  bVar11 = uVar9 == 4;
  bVar12 = power != 1.0;
  v_00 = (undefined *)CONCAT71((int7)((ulong)v >> 8),NAN(power));
  uVar4 = v_min - v_max;
  uVar5 = -uVar4;
  if (0 < (long)uVar4) {
    uVar5 = uVar4;
  }
  fVar20 = (&(bb->Min).x)[uVar10];
  fVar14 = (&(bb->Max).x)[uVar10];
  fVar21 = (fVar14 - fVar20) + -4.0;
  fVar19 = (GImGui->Style).GrabMinSize;
  if (uVar9 != 4) {
    fVar18 = fVar21 / (float)(long)(uVar5 + 1);
    uVar13 = -(uint)(fVar19 <= fVar18);
    fVar19 = (float)(~uVar13 & (uint)fVar19 | (uint)fVar18 & uVar13);
  }
  if (fVar21 <= fVar19) {
    fVar19 = fVar21;
  }
  if (v_max * v_min < 0 && (bVar12 && bVar11)) {
    dVar15 = (double)v_min;
    if (v_min < 0) {
      dVar15 = -dVar15;
    }
    dVar15 = pow(dVar15,1.0 / (double)power);
    dVar16 = (double)v_max;
    if (v_max < 0) {
      dVar16 = -dVar16;
    }
    dVar16 = pow(dVar16,1.0 / (double)power);
    fVar18 = (float)(dVar15 / (dVar16 + dVar15));
  }
  else if (v_min < 0) {
    fVar18 = 1.0;
  }
  else {
    fVar18 = 0.0;
  }
  fVar20 = fVar20 + 2.0 + fVar19 * 0.5;
  if (pIVar2->ActiveId == id) {
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      IVar17 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      fVar21 = IVar17.x;
      if (uVar10 != 0) {
        fVar21 = -IVar17.y;
      }
      if ((pIVar2->NavActivatePressedId == id) && (pIVar2->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if ((fVar21 != 0.0) || (NAN(fVar21))) {
        v_00 = (undefined *)v_max;
        fVar22 = SliderCalcRatioFromValueT<long_long,double>(data_type,*v,v_min,v_max,power,fVar18);
        if (uVar9 == 4) {
          iVar3 = ImParseFormatPrecision(format,3);
          v_00 = (undefined *)
                 (CONCAT71((int7)((ulong)unaff_RBX >> 8),~(bVar12 && bVar11)) & 0xffffffff);
          if ((~(bVar12 && bVar11) & iVar3 < 1) != 0) goto LAB_00150a9e;
          fVar21 = fVar21 / 100.0;
          if (0.0 < (GImGui->IO).NavInputs[0xe]) {
            fVar21 = fVar21 / 10.0;
          }
        }
        else {
LAB_00150a9e:
          if ((uVar5 < 0x65) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            v_00 = &DAT_0018cb58;
            fVar21 = *(float *)(&DAT_0018cb58 + (ulong)(fVar21 < 0.0) * 4) / (float)(long)uVar5;
          }
          else {
            fVar21 = fVar21 / 100.0;
          }
        }
        uVar13 = -(uint)(0.0 < (GImGui->IO).NavInputs[0xf]);
        fVar21 = (float)(~uVar13 & (uint)fVar21 | (uint)(fVar21 * 10.0) & uVar13);
        if (((fVar22 < 1.0) || (fVar21 <= 0.0)) && ((0.0 < fVar22 || (0.0 <= fVar21)))) {
          fVar22 = fVar22 + fVar21;
          fVar21 = 1.0;
          if (fVar22 <= 1.0) {
            fVar21 = fVar22;
          }
          fVar22 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar21);
          goto LAB_00150940;
        }
        bVar1 = false;
        goto LAB_00150ba7;
      }
      fVar22 = 0.0;
      bVar1 = false;
    }
    else {
      fVar22 = 0.0;
      if (pIVar2->ActiveIdSource == ImGuiInputSource_Mouse) {
        if ((pIVar2->IO).MouseDown[0] == false) {
          ClearActiveID();
          fVar22 = 0.0;
          bVar1 = false;
        }
        else {
          if (0.0 < fVar21 - fVar19) {
            fVar21 = (*(float *)((pIVar2->IO).MouseDown + uVar10 * 4 + -8) - fVar20) /
                     (fVar21 - fVar19);
            fVar22 = 1.0;
            if (fVar21 <= 1.0) {
              fVar22 = fVar21;
            }
            fVar22 = (float)(~-(uint)(fVar21 < 0.0) & (uint)fVar22);
          }
          if (uVar10 != 0) {
            fVar22 = 1.0 - fVar22;
          }
LAB_00150940:
          bVar1 = true;
        }
      }
      else {
        bVar1 = false;
      }
    }
LAB_00150ba7:
    if (bVar1) {
      if (bVar12 && bVar11) {
        if (fVar18 <= fVar22) {
          uVar9 = -(uint)(1e-06 < ABS(fVar18 + -1.0));
          fVar21 = powf((float)(~uVar9 & (uint)fVar22 |
                               (uint)((fVar22 - fVar18) / (1.0 - fVar18)) & uVar9),power);
          uVar5 = 0;
          lVar7 = v_max;
          if (0 < v_min) {
            uVar5 = v_min;
          }
        }
        else {
          fVar21 = powf(1.0 - fVar22 / fVar18,power);
          uVar5 = v_max >> 0x3f & v_max;
          lVar7 = v_min;
        }
        v_00 = (undefined *)(lVar7 - uVar5);
        data_type_00 = (ImGuiDataType)(long)((float)(long)v_00 * fVar21 + (float)(long)uVar5);
      }
      else if (uVar9 == 4) {
        data_type_00 = (ImGuiDataType)(long)((float)(v_max - v_min) * fVar22 + (float)v_min);
      }
      else {
        fVar22 = fVar22 * (float)(v_max - v_min);
        lVar6 = (long)fVar22;
        lVar8 = (long)(fVar22 + 0.5);
        if (lVar8 < lVar6) {
          lVar8 = lVar6;
        }
        data_type_00 = (int)lVar8 + (int)v_min;
      }
      lVar7 = RoundScalarWithFormatT<long_long,long_long>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,data_type_00,(longlong)v_00)
      ;
      bVar12 = *v != lVar7;
      if (bVar12) {
        *v = lVar7;
        bVar12 = true;
      }
      goto LAB_00150c05;
    }
  }
  bVar12 = false;
LAB_00150c05:
  fVar21 = SliderCalcRatioFromValueT<long_long,double>(data_type,*v,v_min,v_max,power,fVar18);
  if (uVar10 != 0) {
    fVar21 = 1.0 - fVar21;
  }
  fVar20 = (((fVar14 + -2.0) - fVar19 * 0.5) - fVar20) * fVar21 + fVar20;
  if (uVar10 == 0) {
    fVar21 = -fVar19 * 0.5 + fVar20;
    fVar18 = fVar19 * 0.5 + fVar20;
    fVar14 = (bb->Min).y + 2.0;
    fVar20 = (bb->Max).y + -2.0;
  }
  else {
    fVar21 = (bb->Min).x + 2.0;
    fVar18 = (bb->Max).x + -2.0;
    fVar14 = -fVar19 * 0.5 + fVar20;
    fVar20 = fVar19 * 0.5 + fVar20;
  }
  (out_grab_bb->Min).x = fVar21;
  (out_grab_bb->Min).y = fVar14;
  (out_grab_bb->Max).x = fVar18;
  (out_grab_bb->Max).y = fVar20;
  return bVar12;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz*0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz*0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f/power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f/power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (!is_decimal && v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    // Output grab position so it can be displayed by the caller
    float grab_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
    if (axis == ImGuiAxis_Y)
        grab_t = 1.0f - grab_t;
    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
    if (axis == ImGuiAxis_X)
        *out_grab_bb = ImRect(grab_pos - grab_sz*0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz*0.5f, bb.Max.y - grab_padding);
    else
        *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz*0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz*0.5f);

    return value_changed;
}